

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O2

unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> __thiscall
anon_unknown.dwarf_266b9::read_dic(anon_unknown_dwarf_266b9 *this,string *dic_name)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 local_248;
  string dic_type;
  ifstream ifs;
  byte abStack_200 [488];
  
  std::__cxx11::string::find_last_of((char *)dic_name,0x12e44d);
  std::__cxx11::string::substr((ulong)&dic_type,(ulong)dic_name);
  poVar2 = std::operator<<((ostream *)&std::cout,"read dic from ");
  poVar2 = std::operator<<(poVar2,(string *)dic_name);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ifstream::ifstream(&ifs,(string *)dic_name,_S_in);
  if ((abStack_200[*(long *)(_ifs + -0x18)] & 5) == 0) {
    bVar1 = std::operator==(&dic_type,"SGL");
    if (bVar1) {
      ddd::make_unique<ddd::DictionarySGL<false,false>,std::ifstream&>((ddd *)&local_248,&ifs);
    }
    else {
      bVar1 = std::operator==(&dic_type,"SGL_NL");
      if (bVar1) {
        ddd::make_unique<ddd::DictionarySGL<false,true>,std::ifstream&>((ddd *)&local_248,&ifs);
      }
      else {
        bVar1 = std::operator==(&dic_type,"SGL_BL");
        if (bVar1) {
          ddd::make_unique<ddd::DictionarySGL<true,false>,std::ifstream&>((ddd *)&local_248,&ifs);
        }
        else {
          bVar1 = std::operator==(&dic_type,"SGL_NL_BL");
          if (bVar1) {
            ddd::make_unique<ddd::DictionarySGL<true,true>,std::ifstream&>((ddd *)&local_248,&ifs);
          }
          else {
            bVar1 = std::operator==(&dic_type,"MLT");
            if (bVar1) {
              ddd::make_unique<ddd::DictionaryMLT<false,false>,std::ifstream&>
                        ((ddd *)&local_248,&ifs);
            }
            else {
              bVar1 = std::operator==(&dic_type,"MLT_NL");
              if (bVar1) {
                ddd::make_unique<ddd::DictionaryMLT<false,true>,std::ifstream&>
                          ((ddd *)&local_248,&ifs);
              }
              else {
                bVar1 = std::operator==(&dic_type,"MLT_BL");
                if (bVar1) {
                  ddd::make_unique<ddd::DictionaryMLT<true,false>,std::ifstream&>
                            ((ddd *)&local_248,&ifs);
                }
                else {
                  bVar1 = std::operator==(&dic_type,"MLT_NL_BL");
                  if (!bVar1) {
                    poVar2 = std::operator<<((ostream *)&std::cerr,"invalid extension ");
                    poVar2 = std::operator<<(poVar2,(string *)&dic_type);
                    std::endl<char,std::char_traits<char>>(poVar2);
                    goto LAB_00119ffc;
                  }
                  ddd::make_unique<ddd::DictionaryMLT<true,true>,std::ifstream&>
                            ((ddd *)&local_248,&ifs);
                }
              }
            }
          }
        }
      }
    }
    *(undefined8 *)this = local_248;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"failed to open ");
    poVar2 = std::operator<<(poVar2,(string *)dic_name);
    std::endl<char,std::char_traits<char>>(poVar2);
LAB_00119ffc:
    *(undefined8 *)this = 0;
  }
  std::ifstream::~ifstream(&ifs);
  std::__cxx11::string::~string((string *)&dic_type);
  return (__uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true>)
         (__uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Dictionary> read_dic(const std::string dic_name) {
  std::string dic_type{dic_name.substr(dic_name.find_last_of(".") + 1)};

  std::cout << "read dic from " << dic_name << std::endl;
  std::ifstream ifs{dic_name};
  if (!ifs) {
    std::cerr << "failed to open " << dic_name << std::endl;
    return nullptr;
  }

  if (dic_type == "SGL") {
    return make_unique<DictionarySGL<false, false>>(ifs);
  } else if (dic_type == "SGL_NL") {
    return make_unique<DictionarySGL<false, true>>(ifs);
  } else if (dic_type == "SGL_BL") {
    return make_unique<DictionarySGL<true, false>>(ifs);
  } else if (dic_type == "SGL_NL_BL") {
    return make_unique<DictionarySGL<true, true>>(ifs);
  } else if (dic_type == "MLT") {
    return make_unique<DictionaryMLT<false, false>>(ifs);
  } else if (dic_type == "MLT_NL") {
    return make_unique<DictionaryMLT<false, true>>(ifs);
  } else if (dic_type == "MLT_BL") {
    return make_unique<DictionaryMLT<true, false>>(ifs);
  } else if (dic_type == "MLT_NL_BL") {
    return make_unique<DictionaryMLT<true, true>>(ifs);
  }

  std::cerr << "invalid extension " << dic_type << std::endl;
  return nullptr;
}